

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimfmt.cpp
# Opt level: O2

void __thiscall
icu_63::DecimalFormat::setCurrency(DecimalFormat *this,char16_t *theCurrency,UErrorCode *ec)

{
  DecimalFormatProperties *pDVar1;
  UBool UVar2;
  CurrencyUnit currencyUnit;
  ConstChar16Ptr local_78;
  char16_t *local_70;
  CurrencyUnit local_60;
  CurrencyUnit local_40;
  
  local_78.p_ = theCurrency;
  CurrencyUnit::CurrencyUnit(&local_60,&local_78,ec);
  local_70 = local_78.p_;
  if (*ec < U_ILLEGAL_ARGUMENT_ERROR) {
    pDVar1 = (this->fields->properties).
             super_LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>.ptr;
    if ((pDVar1->currency).fNull == false) {
      CurrencyUnit::CurrencyUnit(&local_40,&(pDVar1->currency).fValue);
      UVar2 = MeasureUnit::operator==(&local_40.super_MeasureUnit,(UObject *)&local_60);
      CurrencyUnit::~CurrencyUnit(&local_40);
      if (UVar2 != '\0') goto LAB_0025203a;
    }
    NumberFormat::setCurrency(&this->super_NumberFormat,theCurrency,ec);
    icu_63::number::impl::NullableValue<icu_63::CurrencyUnit>::operator=
              (&((this->fields->properties).
                 super_LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>.ptr)->
                currency,&local_60);
    touchNoError(this);
  }
LAB_0025203a:
  CurrencyUnit::~CurrencyUnit(&local_60);
  return;
}

Assistant:

void DecimalFormat::setCurrency(const char16_t* theCurrency, UErrorCode& ec) {
    CurrencyUnit currencyUnit(theCurrency, ec);
    if (U_FAILURE(ec)) { return; }
    if (!fields->properties->currency.isNull() && fields->properties->currency.getNoError() == currencyUnit) {
        return;
    }
    NumberFormat::setCurrency(theCurrency, ec); // to set field for compatibility
    fields->properties->currency = currencyUnit;
    // TODO: Set values in fields->symbols, too?
    touchNoError();
}